

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyInteger
               (ResultCollector *result,QueriedState *state,int expected)

{
  ostream *poVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 extraout_EDX_02;
  undefined4 extraout_EDX_03;
  undefined4 extraout_EDX_04;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GLuint reference;
  char *pcVar2;
  float fVar3;
  ostringstream buf;
  string local_1f8;
  float local_1d4;
  string local_1d0;
  long local_1b0;
  ulong local_1a8;
  ostream local_1a0;
  
  switch(state->m_type) {
  case DATATYPE_BOOLEAN:
    if ((state->m_v).vBool == (expected != 0)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    poVar1 = std::operator<<(&local_1a0,"Expected ");
    local_1f8._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_1f8._M_string_length._0_4_ = (uint)(expected != 0);
    poVar1 = tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_1f8,poVar1);
    poVar1 = std::operator<<(poVar1,", got ");
    local_1d0._M_dataplus._M_p = (pointer)glu::getBooleanName;
    local_1d0._M_string_length._0_4_ = (uint)(state->m_v).vBool;
    tcu::Format::Enum<int,_1UL>::toStream((Enum<int,_1UL> *)&local_1d0,poVar1);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1f8);
    break;
  case DATATYPE_INTEGER:
    if ((state->m_v).vInt == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    poVar1 = std::operator<<(&local_1a0,"Expected ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,expected);
    poVar1 = std::operator<<(poVar1,"(");
    local_1a8 = (ulong)expected;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1f8,(de *)&local_1a8,(Hex<8UL> *)CONCAT44(extraout_var_03,extraout_EDX_03));
    poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
    poVar1 = std::operator<<(poVar1,") , got ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(state->m_v).vInt);
    poVar1 = std::operator<<(poVar1,"(");
    local_1b0 = (long)(state->m_v).vInt;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1d0,(de *)&local_1b0,(Hex<8UL> *)CONCAT44(extraout_var_04,extraout_EDX_04));
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1f8);
    break;
  case DATATYPE_INTEGER64:
    if ((state->m_v).vInt64 == (long)expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    poVar1 = std::operator<<(&local_1a0,"Expected ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,"(");
    local_1a8 = (long)expected;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1f8,(de *)&local_1a8,(Hex<8UL> *)CONCAT44(extraout_var_01,extraout_EDX_01));
    poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
    poVar1 = std::operator<<(poVar1,"), got ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,"(");
    local_1b0 = (state->m_v).vInt64;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1d0,(de *)&local_1b0,(Hex<8UL> *)CONCAT44(extraout_var_02,extraout_EDX_02));
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1f8);
    break;
  case DATATYPE_FLOAT:
    fVar3 = deInt32ToFloatRoundToNegInf(expected);
    local_1d4 = deInt32ToFloatRoundToPosInf(expected);
    if ((fVar3 <= (state->m_v).vFloat) && ((state->m_v).vFloat <= local_1d4)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    if ((fVar3 != local_1d4) || (NAN(fVar3) || NAN(local_1d4))) {
      poVar1 = std::operator<<(&local_1a0,"Expected in range [");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar3);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1d4);
      pcVar2 = "], got ";
    }
    else {
      poVar1 = std::operator<<(&local_1a0,"Expected ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar3);
      pcVar2 = ", got ";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::ostream::operator<<(poVar1,(state->m_v).vFloat);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1f8);
    break;
  case DATATYPE_UNSIGNED_INTEGER:
    if ((state->m_v).vInt == expected) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    poVar1 = std::operator<<(&local_1a0,"Expected ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"(");
    local_1a8 = (ulong)(uint)expected;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1f8,(de *)&local_1a8,(Hex<8UL> *)CONCAT44(extraout_var,extraout_EDX));
    poVar1 = std::operator<<(poVar1,(string *)&local_1f8);
    poVar1 = std::operator<<(poVar1,"), got ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    poVar1 = std::operator<<(poVar1,"(");
    local_1b0 = (state->m_v).vInt64;
    de::toString<tcu::Format::Hex<8ul>>
              (&local_1d0,(de *)&local_1b0,(Hex<8UL> *)CONCAT44(extraout_var_00,extraout_EDX_00));
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::operator<<(poVar1,")");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1f8);
    break;
  default:
    goto switchD_014cfb7d_default;
  }
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
switchD_014cfb7d_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}